

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O0

void MyDocument::DisplayContextMenu(MyDocument *doc)

{
  bool bVar1;
  MyDocument *in_RDI;
  char buf [256];
  char acStackY_108 [28];
  ImGuiPopupFlags in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  bVar1 = ImGui::BeginPopupContextItem(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
  if (bVar1) {
    sprintf(acStackY_108,"Save %s",in_RDI->Name);
    bVar1 = ImGui::MenuItem(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            (bool)in_stack_ffffffffffffffbf,(bool)in_stack_ffffffffffffffbe);
    if (bVar1) {
      DoSave(in_RDI);
    }
    bVar1 = ImGui::MenuItem(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            (bool)in_stack_ffffffffffffffbf,(bool)in_stack_ffffffffffffffbe);
    if (bVar1) {
      DoQueueClose(in_RDI);
    }
    ImGui::EndPopup();
  }
  return;
}

Assistant:

static void DisplayContextMenu(MyDocument* doc)
    {
        if (!ImGui::BeginPopupContextItem())
            return;

        char buf[256];
        sprintf(buf, "Save %s", doc->Name);
        if (ImGui::MenuItem(buf, "CTRL+S", false, doc->Open))
            doc->DoSave();
        if (ImGui::MenuItem("Close", "CTRL+W", false, doc->Open))
            doc->DoQueueClose();
        ImGui::EndPopup();
    }